

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O3

void __thiscall unitStrings_si_Test::TestBody(unitStrings_si_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unit_data uVar2;
  precise_unit *ppVar3;
  string *psVar4;
  string *psVar5;
  char *pcVar6;
  unit GPa;
  unit nF;
  internal local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  float local_64;
  AssertHelper local_60;
  ulong local_58;
  string local_50;
  undefined8 local_30;
  undefined8 local_28;
  
  local_28 = 0x174e3089705f;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  local_60.data_ = (AssertHelperData *)0x3e112e0be0000000;
  local_58 = 0x174e;
  psVar4 = &local_50;
  units::to_string_abi_cxx11_(psVar4,(units *)&local_60,ppVar3,0x3e112e0be0000000);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            (local_78,"to_string(nF)","\"nF\"",psVar4,(char (*) [3])0x1f9907);
  paVar1 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_70->_M_dataplus)._M_p;
    }
    psVar4 = (string *)0x4b;
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x4b,pcVar6);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_64 = 1.0 / (float)local_28;
  uVar2 = units::detail::unit_data::operator/
                    ((unit_data *)((long)&units::one + 4),(unit_data *)((long)&local_28 + 4));
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  local_60.data_ = (AssertHelperData *)(double)local_64;
  local_58 = (ulong)(uint)uVar2;
  psVar5 = &local_50;
  units::to_string_abi_cxx11_(psVar5,(units *)&local_60,ppVar3,(uint64_t)psVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            (local_78,"to_string(one / nF)","\"1/nF\"",psVar5,(char (*) [5])"1/nF");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_70->_M_dataplus)._M_p;
    }
    psVar5 = (string *)0x4c;
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x4c,pcVar6);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_64 = 1.0 / (float)local_28;
  uVar2 = units::detail::unit_data::operator/
                    ((unit_data *)((long)&units::currency + 4),(unit_data *)((long)&local_28 + 4));
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  local_60.data_ = (AssertHelperData *)(double)local_64;
  local_58 = (ulong)(uint)uVar2;
  units::to_string_abi_cxx11_(&local_50,(units *)&local_60,ppVar3,(uint64_t)psVar5);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            (local_78,"to_string(currency / nF)","\"$/nF\"",&local_50,(char (*) [5])"$/nF");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x4e,pcVar6);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_30 = 0x1ef4e6e6b28;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  local_60.data_ = (AssertHelperData *)(double)(float)local_30;
  local_58 = (ulong)local_30._4_4_;
  psVar4 = &local_50;
  units::to_string_abi_cxx11_(psVar4,(units *)&local_60,ppVar3,(ulong)local_30._4_4_);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            (local_78,"to_string(GPa)","\"GPa\"",psVar4,(char (*) [4])0x1f993e);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_70->_M_dataplus)._M_p;
    }
    psVar4 = (string *)0x51;
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x51,pcVar6);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_64 = 1.0 / (float)local_30;
  uVar2 = units::detail::unit_data::operator/
                    ((unit_data *)((long)&units::one + 4),(unit_data *)((long)&local_30 + 4));
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  local_60.data_ = (AssertHelperData *)(double)local_64;
  local_58 = (ulong)(uint)uVar2;
  psVar5 = &local_50;
  units::to_string_abi_cxx11_(psVar5,(units *)&local_60,ppVar3,(uint64_t)psVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
            (local_78,"to_string(one / GPa)","\"1/GPa\"",psVar5,(char (*) [6])"1/GPa");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_70->_M_dataplus)._M_p;
    }
    psVar5 = (string *)0x52;
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x52,pcVar6);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  local_64 = (float)local_30;
  uVar2 = units::detail::unit_data::operator/
                    ((unit_data *)((long)&local_30 + 4),(unit_data *)((long)&units::km + 4));
  local_64 = local_64 / 1000.0;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  local_60.data_ = (AssertHelperData *)(double)local_64;
  local_58 = (ulong)(uint)uVar2;
  units::to_string_abi_cxx11_(&local_50,(units *)&local_60,ppVar3,(uint64_t)psVar5);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
            (local_78,"to_string(GPa / km)","\"MPa/m\"",&local_50,(char (*) [6])"MPa/m");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x54,pcVar6);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)((long)&units::ft + 4),(unit_data *)((long)&units::lb + 4));
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  local_60.data_ = (AssertHelperData *)0x3fc1b256a0000000;
  local_58 = (ulong)(uint)uVar2;
  units::to_string_abi_cxx11_(&local_50,(units *)&local_60,ppVar3,0x3fc1b256a0000000);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
            (local_78,"to_string(ft * lb)","\"ft*lb\"",&local_50,(char (*) [6])"ft*lb");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_78[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_70 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_70->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x57,pcVar6);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
  }
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
  }
  return;
}

Assistant:

TEST(unitStrings, si)
{
    auto nF = unit(1e-9, F);
    EXPECT_EQ(to_string(nF), "nF");
    EXPECT_EQ(to_string(one / nF), "1/nF");

    EXPECT_EQ(to_string(currency / nF), "$/nF");

    auto GPa = unit(1e9, Pa);
    EXPECT_EQ(to_string(GPa), "GPa");
    EXPECT_EQ(to_string(one / GPa), "1/GPa");
    // automatic reduction
    EXPECT_EQ(to_string(GPa / km), "MPa/m");

    // two non-si units
    EXPECT_EQ(to_string(ft * lb), "ft*lb");
}